

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawData::DeIndexAllBuffers(ImDrawData *this)

{
  ImVector<unsigned_short> *this_00;
  ImDrawList *pIVar1;
  undefined8 uVar2;
  ImDrawVert *pIVar3;
  ImVec2 IVar4;
  value_type_conflict *pvVar5;
  value_type *pvVar6;
  value_type *pvVar7;
  long lVar8;
  int j;
  int iVar9;
  ImVector<ImDrawVert> local_58;
  ImDrawData *local_40;
  long local_38;
  
  local_58.Size = 0;
  local_58.Capacity = 0;
  local_58.Data = (ImDrawVert *)0x0;
  this->TotalVtxCount = 0;
  this->TotalIdxCount = 0;
  local_40 = this;
  for (lVar8 = 0; lVar8 < this->CmdListsCount; lVar8 = lVar8 + 1) {
    pIVar1 = this->CmdLists[lVar8];
    iVar9 = (pIVar1->IdxBuffer).Size;
    if (iVar9 != 0) {
      local_38 = lVar8;
      ImVector<ImDrawVert>::resize(&local_58,iVar9);
      this_00 = &pIVar1->IdxBuffer;
      for (iVar9 = 0; iVar9 < this_00->Size; iVar9 = iVar9 + 1) {
        pvVar5 = ImVector<unsigned_short>::operator[](this_00,iVar9);
        pvVar6 = ImVector<ImDrawVert>::operator[](&pIVar1->VtxBuffer,(uint)*pvVar5);
        pvVar7 = ImVector<ImDrawVert>::operator[](&local_58,iVar9);
        IVar4 = pvVar6->uv;
        pvVar7->pos = pvVar6->pos;
        pvVar7->uv = IVar4;
        pvVar7->col = pvVar6->col;
      }
      uVar2._0_4_ = (pIVar1->VtxBuffer).Size;
      uVar2._4_4_ = (pIVar1->VtxBuffer).Capacity;
      (pIVar1->VtxBuffer).Size = local_58.Size;
      (pIVar1->VtxBuffer).Capacity = local_58.Capacity;
      pIVar3 = (pIVar1->VtxBuffer).Data;
      (pIVar1->VtxBuffer).Data = local_58.Data;
      local_58._0_8_ = uVar2;
      local_58.Data = pIVar3;
      ImVector<unsigned_short>::resize(this_00,0);
      local_40->TotalVtxCount = local_40->TotalVtxCount + (pIVar1->VtxBuffer).Size;
      lVar8 = local_38;
      this = local_40;
    }
  }
  ImVector<ImDrawVert>::~ImVector(&local_58);
  return;
}

Assistant:

void ImDrawList::AddQuad(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& d, ImU32 col, float thickness)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(a);
    PathLineTo(b);
    PathLineTo(c);
    PathLineTo(d);
    PathStroke(col, true, thickness);
}